

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

string * __thiscall
duckdb_re2::DFA::DumpWorkq_abi_cxx11_(string *__return_storage_ptr__,DFA *this,Workq *q)

{
  char *pcVar1;
  uint *puVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_50;
  
  paVar3 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar3;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(int *)&this->prog_ != 0) {
    puVar2 = *(uint **)((long)&(this->mutex_).mutex_ + 0x10);
    pcVar1 = anon_var_dwarf_643533f + 9;
    do {
      if ((int)*puVar2 < (this->mutex_).mutex_.__data.__cur_writer) {
        StringPrintf_abi_cxx11_(&local_50,"%s%d",pcVar1,(ulong)*puVar2,in_R8,in_R9,paVar3);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pcVar1 = ",";
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        pcVar1 = anon_var_dwarf_643533f + 9;
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != (uint *)((long)*(int *)&this->prog_ * 4 +
                               *(long *)((long)&(this->mutex_).mutex_ + 0x10)));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DFA::DumpWorkq(Workq* q) {
  std::string s;
  const char* sep = "";
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    if (q->is_mark(*it)) {
      s += "|";
      sep = "";
    } else {
      s += StringPrintf("%s%d", sep, *it);
      sep = ",";
    }
  }
  return s;
}